

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_sampler_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  uint32_t id;
  undefined8 in_RAX;
  SPIRType *pSVar1;
  undefined8 uStack_38;
  
  id = this->argument_buffer_padding_sampler_type_id;
  uStack_38 = in_RAX;
  if (id == 0) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    uStack_38 = CONCAT44(0x1a,(undefined4)uStack_38);
    pSVar1 = Compiler::set<spirv_cross::SPIRType,spv::Op>
                       ((Compiler *)this,id,(Op *)((long)&uStack_38 + 4));
    pSVar1->basetype = Sampler;
    pSVar1->storage = StorageClassUniformConstant;
    this->argument_buffer_padding_sampler_type_id = id;
  }
  add_argument_buffer_padding_type(this,id,struct_type,mbr_idx,arg_buff_index,rez_bind->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_sampler_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                           uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_sampler_type_id)
	{
		uint32_t samp_type_id = ir.increase_bound_by(1);
		auto &samp_type = set<SPIRType>(samp_type_id, OpTypeSampler);
		samp_type.basetype = SPIRType::Sampler;
		samp_type.storage = StorageClassUniformConstant;

		argument_buffer_padding_sampler_type_id = samp_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_sampler_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}